

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O0

void define_print(TCCState *s1,int v)

{
  FILE *__stream;
  Sym *pSVar1;
  char *pcVar2;
  Sym *local_30;
  Sym *a;
  Sym *s;
  FILE *fp;
  int v_local;
  TCCState *s1_local;
  
  pSVar1 = define_find(v);
  if ((pSVar1 != (Sym *)0x0) && ((pSVar1->field_3).enum_val != 0)) {
    __stream = (FILE *)s1->ppfp;
    pcVar2 = get_tok_str(v,(CValue *)0x0);
    fprintf(__stream,"#define %s",pcVar2);
    if ((pSVar1->type).t == 1) {
      local_30 = (pSVar1->field_5).next;
      fprintf(__stream,"(");
      if (local_30 != (Sym *)0x0) {
        while( true ) {
          pcVar2 = get_tok_str(local_30->v & 0xdfffffff,(CValue *)0x0);
          fprintf(__stream,"%s",pcVar2);
          local_30 = (local_30->field_5).next;
          if (local_30 == (Sym *)0x0) break;
          fprintf(__stream,",");
        }
      }
      fprintf(__stream,")");
    }
    tok_print("",(pSVar1->field_3).d);
  }
  return;
}

Assistant:

static void define_print(TCCState* s1, int v) {
  FILE* fp;
  Sym* s;

  s = define_find(v);
  if (NULL == s || NULL == s->d)
    return;

  fp = s1->ppfp;
  fprintf(fp, "#define %s", get_tok_str(v, NULL));
  if (s->type.t == MACRO_FUNC) {
    Sym* a = s->next;
    fprintf(fp, "(");
    if (a)
      for (;;) {
        fprintf(fp, "%s", get_tok_str(a->v & ~SYM_FIELD, NULL));
        if (!(a = a->next))
          break;
        fprintf(fp, ",");
      }
    fprintf(fp, ")");
  }
  tok_print("", s->d);
}